

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O2

string * ApprovalTests::StringUtils::replaceAll
                   (string *__return_storage_ptr__,string *inText,string *find,string *replaceWith)

{
  ulong uVar1;
  
  while( true ) {
    uVar1 = ::std::__cxx11::string::find((string *)inText,(ulong)find);
    if (uVar1 == 0xffffffffffffffff) break;
    ::std::__cxx11::string::replace((ulong)inText,uVar1,(string *)find->_M_string_length);
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)inText);
  return __return_storage_ptr__;
}

Assistant:

APPROVAL_TESTS_NO_DISCARD
    std::string StringUtils::replaceAll(std::string inText,
                                        const std::string& find,
                                        const std::string& replaceWith)
    {
        size_t start_pos = 0;
        while ((start_pos = inText.find(find, start_pos)) != std::string::npos)
        {
            inText.replace(start_pos, find.length(), replaceWith);
            start_pos +=
                replaceWith.length(); // Handles case where 'to' is a substring of 'from'
        }
        return inText;
    }